

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

bool clunk::VerifyMoveMap(int from,uint64_t map)

{
  uint uVar1;
  ulong uVar2;
  int local_218;
  int sqr;
  int sqrs [128];
  uint64_t map_local;
  int from_local;
  
  sqrs._504_8_ = map;
  if ((from & 0xffffff88U) != 0) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0x1c1,"bool clunk::VerifyMoveMap(const int, uint64_t)");
  }
  memset(&local_218,0,0x200);
  (&local_218)[from] = 1;
  while( true ) {
    if (sqrs._504_8_ == 0) {
      return true;
    }
    if ((sqrs._504_8_ & 0xff) == 0) {
      return false;
    }
    uVar1 = ((uint)sqrs._504_8_ & 0xff) - 1;
    if ((uVar1 & 0xffffff88) != 0) {
      return false;
    }
    if ((&local_218)[(int)uVar1] != 0) break;
    (&local_218)[(int)uVar1] = 1;
    uVar2 = (ulong)sqrs._504_8_ >> 8;
    sqrs[0x7e] = (int)uVar2;
    sqrs[0x7f] = (int)(uVar2 >> 0x20);
  }
  return false;
}

Assistant:

bool VerifyMoveMap(const int from, uint64_t map) {
  assert(IS_SQUARE(from));
  int sqrs[128] = {0};
  int sqr;
  sqrs[from] = 1;
  while (map) {
    if (!(map & 0xFF)) {
      return false;
    }
    sqr = ((map & 0xFF) - 1);
    if (!IS_SQUARE(sqr)) {
      return false;
    }
    if (sqrs[sqr]) {
      return false;
    }
    sqrs[sqr] = 1;
    map >>= 8;
  }
  return true;
}